

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

bool HasIntegerMembersInRange
               (ExternTypeInfo *type,uint fromOffset,uint toOffset,ExternTypeInfo *exTypes,
               ExternMemberInfo *exTypeExtra)

{
  ExternMemberInfo *pEVar1;
  ExternTypeInfo *type_00;
  bool bVar2;
  bool opaqueType;
  ExternTypeInfo *memberType;
  ExternMemberInfo *member;
  uint m;
  ExternMemberInfo *exTypeExtra_local;
  ExternTypeInfo *exTypes_local;
  uint toOffset_local;
  uint fromOffset_local;
  ExternTypeInfo *type_local;
  
  member._4_4_ = 0;
  do {
    if ((type->field_8).arrSize <= member._4_4_) {
      return false;
    }
    pEVar1 = exTypeExtra + ((type->field_11).subType + member._4_4_);
    type_00 = exTypes + pEVar1->type;
    if (type_00->type == TYPE_COMPLEX) {
      bVar2 = true;
      if (type_00->subCat == CAT_CLASS) {
        bVar2 = (type_00->field_8).arrSize == 0;
      }
      if (bVar2) {
        if ((fromOffset < pEVar1->offset + type_00->size) && (pEVar1->offset < toOffset)) {
          return true;
        }
      }
      else {
        bVar2 = HasIntegerMembersInRange
                          (type_00,fromOffset - pEVar1->offset,toOffset - pEVar1->offset,exTypes,
                           exTypeExtra);
        if (bVar2) {
          return true;
        }
      }
    }
    else if ((((type_00->type != TYPE_FLOAT) && (type_00->type != TYPE_DOUBLE)) &&
             (fromOffset < pEVar1->offset + type_00->size)) && (pEVar1->offset < toOffset)) {
      return true;
    }
    member._4_4_ = member._4_4_ + 1;
  } while( true );
}

Assistant:

bool HasIntegerMembersInRange(ExternTypeInfo &type, unsigned fromOffset, unsigned toOffset, ExternTypeInfo *exTypes, ExternMemberInfo *exTypeExtra)
{
	for(unsigned m = 0; m < type.memberCount; m++)
	{
		ExternMemberInfo &member = exTypeExtra[type.memberOffset + m];

		ExternTypeInfo &memberType = exTypes[member.type];

		if(memberType.type == ExternTypeInfo::TYPE_COMPLEX)
		{
			// Handle opaque types
			bool opaqueType = memberType.subCat != ExternTypeInfo::CAT_CLASS || memberType.memberCount == 0;

			if(opaqueType)
			{
				if(member.offset + memberType.size > fromOffset && member.offset < toOffset)
					return true;
			}
			else
			{
				if(HasIntegerMembersInRange(memberType, fromOffset - member.offset, toOffset - member.offset, exTypes, exTypeExtra))
					return true;
			}
		}
		else if(memberType.type != ExternTypeInfo::TYPE_FLOAT && memberType.type != ExternTypeInfo::TYPE_DOUBLE)
		{
			if(member.offset + memberType.size > fromOffset && member.offset < toOffset)
				return true;
		}
	}

	return false;
}